

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

void burstsort_superalphabet_vector(uchar **strings,size_t n)

{
  TrieNode<unsigned_short> *this;
  TrieNode<unsigned_short> *root;
  size_t n_local;
  uchar **strings_local;
  
  this = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this);
  insert<32000u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_short>,unsigned_short>
            (this,strings,n);
  traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_short>
            (this,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<32000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}